

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O1

fdb_status sb_write(filemgr *file,size_t sb_no,err_log_callback *log_callback)

{
  atomic<unsigned_int> *paVar1;
  atomic<unsigned_long> *paVar2;
  uint uVar3;
  sb_rsv_bmp *psVar4;
  void *buf;
  int iVar5;
  uint32_t uVar6;
  ulong uVar7;
  ulong uVar8;
  ssize_t sVar9;
  long lVar10;
  fdb_status fVar11;
  size_t __n;
  size_t buf_len;
  long lVar12;
  bool bVar13;
  void *buf_aligned;
  err_log_callback *local_290;
  _Any_data local_288;
  code *local_278;
  code *pcStack_270;
  FdbGcFunc gc;
  char errno_msg [512];
  
  uVar3 = file->blocksize;
  buf_aligned = (void *)0x0;
  iVar5 = posix_memalign(&buf_aligned,0x200,(ulong)uVar3);
  if (iVar5 != 0) {
    buf_aligned = (void *)0x0;
  }
  buf = buf_aligned;
  local_288._8_8_ = 0;
  pcStack_270 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc:1236:18)>
                ::_M_invoke;
  local_278 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc:1236:18)>
              ::_M_manager;
  gc.done = false;
  local_288._M_unused._M_object = &buf_aligned;
  std::function<void_()>::function(&gc.func,(function<void_()> *)&local_288);
  local_290 = log_callback;
  if (local_278 != (code *)0x0) {
    (*local_278)(&local_288,&local_288,__destroy_functor);
  }
  __n = (size_t)(int)uVar3;
  bVar13 = false;
  memset(buf,0,__n);
  uVar8 = file->version;
  *(ulong *)buf =
       uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
       (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  uVar8 = (file->sb->revnum).super___atomic_base<unsigned_long>._M_i;
  *(ulong *)((long)buf + 8) =
       uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
       (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  *(__int_type *)((long)buf + 0x10) =
       (file->sb->bmp_revnum).super___atomic_base<unsigned_long>._M_i << 0x38 |
       ((file->sb->bmp_revnum).super___atomic_base<unsigned_long>._M_i & 0xff00) << 0x28 |
       ((file->sb->bmp_revnum).super___atomic_base<unsigned_long>._M_i & 0xff0000) << 0x18 |
       (ulong)((uint)(file->sb->bmp_revnum).super___atomic_base<unsigned_long>._M_i & 0xff000000) <<
       8 | (ulong)((uint)((file->sb->bmp_revnum).super___atomic_base<unsigned_long>._M_i >> 8) &
                  0xff000000) |
           (file->sb->bmp_revnum).super___atomic_base<unsigned_long>._M_i >> 0x18 & 0xff0000 |
           (file->sb->bmp_revnum).super___atomic_base<unsigned_long>._M_i >> 0x28 & 0xff00 |
           (file->sb->bmp_revnum).super___atomic_base<unsigned_long>._M_i >> 0x38;
  uVar8 = (file->sb->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i;
  *(ulong *)((long)buf + 0x18) =
       uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
       (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  uVar8 = (file->sb->last_hdr_bid).super___atomic_base<unsigned_long>._M_i;
  *(ulong *)((long)buf + 0x20) =
       uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
       (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  uVar8 = (file->sb->last_hdr_revnum).super___atomic_base<unsigned_long>._M_i;
  *(ulong *)((long)buf + 0x28) =
       uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
       (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  uVar8 = file->sb->min_live_hdr_revnum;
  *(ulong *)((long)buf + 0x30) =
       uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
       (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  uVar8 = file->sb->min_live_hdr_bid;
  *(ulong *)((long)buf + 0x38) =
       uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
       (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  uVar8 = file->sb->num_init_free_blocks;
  *(ulong *)((long)buf + 0x40) =
       uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
       (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  uVar8 = file->sb->num_free_blocks;
  *(ulong *)((long)buf + 0x48) =
       uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
       (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  uVar8 = (file->sb->bmp_size).super___atomic_base<unsigned_long>._M_i;
  *(ulong *)((long)buf + 0x50) =
       uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
       (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
       (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  psVar4 = file->sb->rsv_bmp;
  if (psVar4 != (sb_rsv_bmp *)0x0) {
    paVar1 = &psVar4->status;
    LOCK();
    bVar13 = (paVar1->super___atomic_base<unsigned_int>)._M_i == 0xffff;
    if (bVar13) {
      (paVar1->super___atomic_base<unsigned_int>)._M_i = 2;
    }
    UNLOCK();
  }
  if (bVar13) {
    uVar7 = file->sb->rsv_bmp->bmp_size;
    uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
            (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
            (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
  }
  else {
    uVar7 = 0;
  }
  *(ulong *)((long)buf + 0x58) = uVar7;
  buf_len = 0x60;
  if (0x7fffff < uVar8 + 0x7fffff) {
    lVar10 = 0;
    do {
      lVar12 = lVar10;
      uVar7 = *(ulong *)((long)file->sb->bmp_doc_offset + lVar12);
      *(ulong *)((long)buf + lVar12 + 0x60) =
           uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
           (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
           (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
      lVar10 = lVar12 + 8;
    } while ((uVar8 + 0x7fffff >> 0x17) * 8 != lVar12 + 8);
    buf_len = lVar12 + 0x68;
  }
  if (bVar13) {
    uVar8 = file->sb->rsv_bmp->bmp_size + 0x7fffff;
    if (0x7fffff < uVar8) {
      lVar10 = 0;
      do {
        uVar7 = *(ulong *)((long)file->sb->rsv_bmp->bmp_doc_offset + lVar10);
        *(ulong *)((long)buf + lVar10 + buf_len) =
             uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
             (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
             (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
        lVar10 = lVar10 + 8;
      } while ((uVar8 >> 0x17) * 8 != lVar10);
      buf_len = buf_len + lVar10;
    }
    LOCK();
    (file->sb->rsv_bmp->status).super___atomic_base<unsigned_int>._M_i = 0xffff;
    UNLOCK();
  }
  uVar6 = get_checksum((uint8_t *)buf,buf_len,file->crc_mode);
  *(uint32_t *)((long)buf + buf_len) =
       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  *(undefined1 *)((long)buf + (long)(int)(uVar3 - 1)) = 0xcc;
  sVar9 = (*file->ops->pwrite)(file->fd,buf,__n,__n * sb_no);
  if (uVar3 == (uint)sVar9) {
    LOCK();
    paVar2 = &file->sb->revnum;
    (paVar2->super___atomic_base<unsigned_long>)._M_i =
         (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    fVar11 = FDB_RESULT_SUCCESS;
  }
  else {
    (*file->ops->get_errno_str)(errno_msg,0x200);
    fVar11 = FDB_RESULT_SB_RACE_CONDITION;
    fdb_log_impl(local_290,2,FDB_RESULT_SB_RACE_CONDITION,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                 ,"sb_write",0x553,"Failed to write the superblock (number: %lu), %s",sb_no,
                 errno_msg);
  }
  FdbGcFunc::~FdbGcFunc(&gc);
  return fVar11;
}

Assistant:

fdb_status sb_write(struct filemgr *file, size_t sb_no,
                    err_log_callback * log_callback)
{
    int r;
    int real_blocksize = file->blocksize;
    int blocksize = file->blocksize - BLK_MARKER_SIZE;

    void* buf_aligned = nullptr;
    malloc_align(buf_aligned, FDB_SECTOR_SIZE, file->blocksize);
    uint8_t *buf = (uint8_t*)buf_aligned;
    FdbGcFunc gc([&](){ free_align(buf_aligned); });

    uint32_t crc, _crc;
    uint64_t enc_u64;
    uint64_t num_docs;
    size_t i, offset;
    fdb_status fs;

    memset(buf, 0x0, real_blocksize);

    offset = 0;
    // magic number
    enc_u64 = _endian_encode(file->version);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // revision number
    uint64_t sb_revnum = atomic_get_uint64_t(&file->sb->revnum);
    enc_u64 = _endian_encode(sb_revnum);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // bitmap's revision number
    enc_u64 = _endian_encode(atomic_get_uint64_t(&file->sb->bmp_revnum));
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // cur_alloc_bid
    bid_t sb_cur_alloc_bid = atomic_get_uint64_t(&file->sb->cur_alloc_bid);
    enc_u64 = _endian_encode(sb_cur_alloc_bid);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // last header bid
    bid_t sb_last_hdr_bid = atomic_get_uint64_t(&file->sb->last_hdr_bid);
    enc_u64 = _endian_encode(sb_last_hdr_bid);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // last header rev number
    uint64_t sb_last_hdr_revnum = atomic_get_uint64_t(&file->sb->last_hdr_revnum);
    enc_u64 = _endian_encode(sb_last_hdr_revnum);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // minimum active header revnum
    enc_u64 = _endian_encode(file->sb->min_live_hdr_revnum);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // minimum active header BID
    enc_u64 = _endian_encode(file->sb->min_live_hdr_bid);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // # initial free blocks
    enc_u64 = _endian_encode(file->sb->num_init_free_blocks);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // # free blocks
    enc_u64 = _endian_encode(file->sb->num_free_blocks);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // bitmap size
    uint64_t sb_bmp_size = atomic_get_uint64_t(&file->sb->bmp_size);
    enc_u64 = _endian_encode(sb_bmp_size);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    bool rsv_bmp_enabled = false;

    if ( file->sb->rsv_bmp &&
         atomic_cas_uint32_t(&file->sb->rsv_bmp->status,
                             SB_RSV_READY, SB_RSV_WRITING) ) {
        rsv_bmp_enabled = true;
        // status becomes 'WRITING' so that switching will be postponed.
        // note that 'rsv_bmp' is not currently used yet so that
        // it won't block any other tasks except for switching.
    }

    // reserved bitmap size (0 if not exist)
    if (rsv_bmp_enabled) {
        enc_u64 = _endian_encode(file->sb->rsv_bmp->bmp_size);
    } else {
        enc_u64 = 0;
    }
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // bitmap doc offsets
    num_docs = _bmp_size_to_num_docs(sb_bmp_size);
    for (i=0; i<num_docs; ++i) {
        enc_u64 = _endian_encode(file->sb->bmp_doc_offset[i]);
        memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
        offset += sizeof(enc_u64);
    }

    // reserved bitmap doc offsets
    if (rsv_bmp_enabled) {
        num_docs = _bmp_size_to_num_docs(file->sb->rsv_bmp->bmp_size);
        for (i=0; i<num_docs; ++i) {
            enc_u64 = _endian_encode(file->sb->rsv_bmp->bmp_doc_offset[i]);
            memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
            offset += sizeof(enc_u64);
        }

        atomic_store_uint32_t(&file->sb->rsv_bmp->status, SB_RSV_READY);
    }

    // CRC
    crc = get_checksum(buf, offset, file->crc_mode);
    _crc = _endian_encode(crc);
    memcpy(buf + offset, &_crc, sizeof(_crc));

    // set block marker
    memset(buf + blocksize, BLK_MARKER_SB, BLK_MARKER_SIZE);

    // directly write a block bypassing block cache
    r = file->ops->pwrite(file->fd, buf, real_blocksize, sb_no * real_blocksize);
    if (r != real_blocksize) {
        char errno_msg[512];
        file->ops->get_errno_str(errno_msg, 512);
        fs = FDB_RESULT_SB_RACE_CONDITION;
        fdb_log(log_callback, FDB_LOG_ERROR, fs,
                "Failed to write the superblock (number: %" _F64 "), %s",
                sb_no, errno_msg);
        return fs;
    }

    // increase superblock's revision number
    atomic_incr_uint64_t(&file->sb->revnum);
    return FDB_RESULT_SUCCESS;
}